

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O0

int __thiscall
UnifiedRegex::ChompCharGroupInst<(UnifiedRegex::ChompMode)0>::Print
          (ChompCharGroupInst<(UnifiedRegex::ChompMode)0> *this,DebugWriter *w,Label label,
          Char *litbuf)

{
  Char *litbuf_local;
  Label label_local;
  DebugWriter *w_local;
  ChompCharGroupInst<(UnifiedRegex::ChompMode)0> *this_local;
  
  DebugWriter::Print(w,L"L%04x: ",(ulong)label);
  if ((DAT_01ec73dd & 1) != 0) {
    DebugWriter::Print(w,L"(0x%03x bytes) ",8);
  }
  DebugWriter::Print(w,L"ChompCharGroup<Star>");
  DebugWriter::Print(w,L"(");
  CharMixin::Print(&this->super_CharMixin,w,litbuf);
  DebugWriter::Print(w,L", ");
  GroupMixin::Print(&this->super_GroupMixin,w,litbuf);
  DebugWriter::Print(w,L", ");
  NoNeedToSaveMixin::Print(&this->super_NoNeedToSaveMixin,w,litbuf);
  DebugWriter::PrintEOL(w,L")");
  if ((DAT_01ec73dd & 1) != 0) {
    DebugWriter::Indent(w);
    Inst::PrintBytes<UnifiedRegex::Inst>
              (&this->super_Inst,w,&this->super_Inst,&this->super_Inst,L"Inst");
    Inst::PrintBytes<UnifiedRegex::CharMixin>
              (&this->super_Inst,w,&this->super_Inst,&this->super_CharMixin,L"CharMixin");
    Inst::PrintBytes<UnifiedRegex::GroupMixin>
              (&this->super_Inst,w,&this->super_Inst,&this->super_GroupMixin,L"GroupMixin");
    Inst::PrintBytes<UnifiedRegex::NoNeedToSaveMixin>
              (&this->super_Inst,w,&this->super_Inst,&this->super_NoNeedToSaveMixin,
               L"NoNeedToSaveMixin");
    DebugWriter::Unindent(w);
  }
  return 8;
}

Assistant:

int ChompCharGroupInst<Mode>::Print(DebugWriter* w, Label label, const Char* litbuf) const
    {
        if (Mode == ChompMode::Star)
        {
            PRINT_RE_BYTECODE_BEGIN("ChompCharGroup<Star>");
        }
        else
        {
            PRINT_RE_BYTECODE_BEGIN("ChompCharGroup<Plus>");
        }

        PRINT_MIXIN_COMMA(CharMixin);
        PRINT_MIXIN_COMMA(GroupMixin);
        PRINT_MIXIN(NoNeedToSaveMixin);
        PRINT_RE_BYTECODE_MID();
        PRINT_BYTES(CharMixin);
        PRINT_BYTES(GroupMixin);
        PRINT_BYTES(NoNeedToSaveMixin);
        PRINT_RE_BYTECODE_END();
    }